

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262.c
# Opt level: O0

int h262_picparm(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm)

{
  int iVar1;
  int iVar2;
  long in_RDX;
  int *in_RSI;
  int *in_RDI;
  uint32_t tmp;
  int b;
  int f;
  undefined8 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 0;
  uVar3 = 0;
  iVar2 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  iVar1 = vs_u((bitstream *)0x0,
               (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),iVar2);
  if (((iVar1 == 0) &&
      (iVar1 = vs_u((bitstream *)CONCAT44(uVar4,uVar3),
                    (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),iVar2)
      , iVar1 == 0)) &&
     (iVar1 = vs_u((bitstream *)CONCAT44(uVar4,uVar3),
                   (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),iVar2),
     iVar1 == 0)) {
    switch(*(undefined4 *)(in_RDX + 4)) {
    case 1:
      break;
    case 2:
      uVar4 = 1;
      break;
    case 3:
      uVar3 = 1;
      uVar4 = 1;
      break;
    case 4:
      break;
    default:
      fprintf(_stderr,"Invalid picture_coding_type\n");
      return 1;
    }
    if (uVar4 == 0) {
      iVar1 = vs_infer((bitstream *)(ulong)uVar3,
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),0);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = vs_infer((bitstream *)CONCAT44(uVar4,uVar3),
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),0);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      iVar1 = vs_u((bitstream *)CONCAT44(uVar4,uVar3),
                   (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),0);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = vs_u((bitstream *)CONCAT44(uVar4,uVar3),
                   (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),0);
      if (iVar1 != 0) {
        return 1;
      }
    }
    if (uVar3 == 0) {
      iVar1 = vs_infer((bitstream *)((ulong)uVar4 << 0x20),
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),0);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = vs_infer((bitstream *)CONCAT44(uVar4,uVar3),
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),0);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      iVar1 = vs_u((bitstream *)CONCAT44(uVar4,uVar3),
                   (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),0);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = vs_u((bitstream *)CONCAT44(uVar4,uVar3),
                   (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),0);
      if (iVar1 != 0) {
        return 1;
      }
    }
    iVar1 = 0;
    do {
      iVar2 = vs_u((bitstream *)CONCAT44(uVar4,uVar3),
                   (uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),0);
      if (iVar2 != 0) {
        return 1;
      }
      if (iVar1 == 0) {
        if (*in_RDI == 1) {
          *(undefined4 *)(in_RDX + 0x1c) = 0;
          *(undefined4 *)(in_RDX + 0x490) = 0;
          *(undefined4 *)(in_RDX + 0x74) = 0;
          *(undefined4 *)(in_RDX + 0x178) = 0;
          *(undefined4 *)(in_RDX + 0x27c) = 0;
          *(undefined4 *)(in_RDX + 0x380) = 0;
        }
        if (*(int *)(in_RDX + 0x1c) == 0) {
          iVar2 = vs_infer((bitstream *)CONCAT44(uVar4,uVar3),
                           (uint32_t *)(ulong)in_stack_ffffffffffffffd0,0);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infer((bitstream *)CONCAT44(uVar4,uVar3),
                           (uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),0);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infer((bitstream *)CONCAT44(uVar4,uVar3),
                           (uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),0);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infer((bitstream *)CONCAT44(uVar4,uVar3),
                           (uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),0);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infer((bitstream *)CONCAT44(uVar4,uVar3),
                           (uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),0);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infer((bitstream *)CONCAT44(uVar4,uVar3),
                           (uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),0);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infer((bitstream *)CONCAT44(uVar4,uVar3),
                           (uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),0);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infer((bitstream *)CONCAT44(uVar4,uVar3),
                           (uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),0);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infer((bitstream *)CONCAT44(uVar4,uVar3),
                           (uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),0);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infer((bitstream *)CONCAT44(uVar4,uVar3),
                           (uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),0);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infer((bitstream *)CONCAT44(uVar4,uVar3),
                           (uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),0);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infer((bitstream *)CONCAT44(uVar4,uVar3),
                           (uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),0);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infer((bitstream *)CONCAT44(uVar4,uVar3),
                           (uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),0);
          if (iVar2 != 0) {
            return 1;
          }
          iVar1 = vs_infer((bitstream *)CONCAT44(uVar4,uVar3),
                           (uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),0);
          if (iVar1 != 0) {
            return 1;
          }
        }
        *(uint *)(in_RDX + 0x4a0) = *in_RSI + 0xfU >> 4;
        *(uint *)(in_RDX + 0x4a4) = in_RSI[1] + 0xfU >> 4;
        *(int *)(in_RDX + 0x4a8) = *(int *)(in_RDX + 0x4a0) * *(int *)(in_RDX + 0x4a4);
        return 0;
      }
      iVar2 = vs_u((bitstream *)CONCAT44(uVar4,uVar3),
                   (uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),0);
    } while (iVar2 == 0);
  }
  return 1;
}

Assistant:

int h262_picparm(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm) {
	int f = 0, b = 0;
	if (vs_u(str, &picparm->temporal_reference, 10)) return 1;
	if (vs_u(str, &picparm->picture_coding_type, 3)) return 1;
	if (vs_u(str, &picparm->vbv_delay, 16)) return 1;
	switch (picparm->picture_coding_type) {
		case H262_PIC_TYPE_I:
			break;
		case H262_PIC_TYPE_P:
			f = 1;
			break;
		case H262_PIC_TYPE_B:
			f = b = 1;
			break;
		case H262_PIC_TYPE_D:
			break;
		default:
			fprintf(stderr, "Invalid picture_coding_type\n");
			return 1;
	}
	if (f) {
		if (vs_u(str, &picparm->full_pel_forward_vector, 1)) return 1;
		if (vs_u(str, &picparm->forward_f_code, 3)) return 1;
	} else {
		if (vs_infer(str, &picparm->full_pel_forward_vector, 1)) return 1;
		if (vs_infer(str, &picparm->forward_f_code, 7)) return 1;
	}
	if (b) {
		if (vs_u(str, &picparm->full_pel_backward_vector, 1)) return 1;
		if (vs_u(str, &picparm->backward_f_code, 3)) return 1;
	} else {
		if (vs_infer(str, &picparm->full_pel_backward_vector, 1)) return 1;
		if (vs_infer(str, &picparm->backward_f_code, 7)) return 1;
	}
	uint32_t tmp = 0;
	while(1) {
		if (vs_u(str, &tmp, 1)) return 1;
		if (!tmp)
			break;
		if (vs_u(str, &tmp, 8)) return 1;
	}
	if (str->dir == VS_DECODE) {
		picparm->is_ext = 0;
		picparm->has_disp_ext = 0;
		picparm->load_intra_quantiser_matrix = 0;
		picparm->load_non_intra_quantiser_matrix = 0;
		picparm->load_chroma_intra_quantiser_matrix = 0;
		picparm->load_chroma_non_intra_quantiser_matrix = 0;
	}
	if (!picparm->is_ext) {
		if (vs_infer(str, &picparm->f_code[0][0], picparm->forward_f_code)) return 1;
		if (vs_infer(str, &picparm->f_code[0][1], picparm->forward_f_code)) return 1;
		if (vs_infer(str, &picparm->f_code[1][0], picparm->backward_f_code)) return 1;
		if (vs_infer(str, &picparm->f_code[1][1], picparm->backward_f_code)) return 1;
		if (vs_infer(str, &picparm->intra_dc_precision, 0)) return 1;
		if (vs_infer(str, &picparm->picture_structure, H262_PIC_STRUCT_FRAME)) return 1;
		if (vs_infer(str, &picparm->top_field_first, 0)) return 1;
		if (vs_infer(str, &picparm->frame_pred_frame_dct, 1)) return 1;
		if (vs_infer(str, &picparm->concealment_motion_vectors, 0)) return 1;
		if (vs_infer(str, &picparm->intra_vlc_format, 0)) return 1;
		if (vs_infer(str, &picparm->repeat_first_field, 0)) return 1;
		if (vs_infer(str, &picparm->chroma_420_type, 1)) return 1;
		if (vs_infer(str, &picparm->progressive_frame, 1)) return 1;
		if (vs_infer(str, &picparm->composite_display_flag, 0)) return 1;
	}
	picparm->pic_width_in_mbs = (seqparm->horizontal_size + 15) / 16;
	picparm->pic_height_in_mbs = (seqparm->vertical_size + 15) / 16;
	picparm->pic_size_in_mbs = picparm->pic_width_in_mbs * picparm->pic_height_in_mbs;
	return 0;
}